

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::ensure_builtin(CompilerMSL *this,StorageClass storage,BuiltIn builtin)

{
  bool bVar1;
  Bitset *local_20;
  Bitset *active_builtins;
  BuiltIn builtin_local;
  StorageClass storage_local;
  CompilerMSL *this_local;
  
  local_20 = (Bitset *)0x0;
  if (storage == StorageClassInput) {
    local_20 = &(this->super_CompilerGLSL).super_Compiler.active_input_builtins;
  }
  else if (storage == StorageClassOutput) {
    local_20 = &(this->super_CompilerGLSL).super_Compiler.active_output_builtins;
  }
  if ((local_20 != (Bitset *)0x0) && (bVar1 = Bitset::get(local_20,builtin), !bVar1)) {
    Bitset::set(local_20,builtin);
    Compiler::force_recompile((Compiler *)this);
  }
  return;
}

Assistant:

void CompilerMSL::ensure_builtin(spv::StorageClass storage, spv::BuiltIn builtin)
{
	Bitset *active_builtins = nullptr;
	switch (storage)
	{
	case StorageClassInput:
		active_builtins = &active_input_builtins;
		break;

	case StorageClassOutput:
		active_builtins = &active_output_builtins;
		break;

	default:
		break;
	}

	// At this point, the specified builtin variable must have already been declared in the entry point.
	// If not, mark as active and force recompile.
	if (active_builtins != nullptr && !active_builtins->get(builtin))
	{
		active_builtins->set(builtin);
		force_recompile();
	}
}